

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O0

void lsp::LanguageService::toClient_request_workspace_workspaceFolders(void)

{
  uint32_t uVar1;
  element_type *this;
  element_type *this_00;
  response_callback local_1e0;
  undefined1 local_1c0 [144];
  string local_130;
  undefined1 local_110 [8];
  Request request;
  undefined1 local_48 [8];
  Id id;
  json paramsjson;
  
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)((long)&id.string_id_.field_2 + 8),(nullptr_t)0x0);
  uVar1 = getNextRequestID();
  jsonrpcpp::Id::Id((Id *)local_48,uVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"workspace/workspaceFolders",(allocator<char> *)(local_1c0 + 0x8f)
            );
  jsonrpcpp::Parameter::Parameter
            ((Parameter *)(local_1c0 + 0x30),(Json *)((long)&id.string_id_.field_2 + 8));
  jsonrpcpp::Request::Request
            ((Request *)local_110,(Id *)local_48,&local_130,(Parameter *)(local_1c0 + 0x30));
  jsonrpcpp::Parameter::~Parameter((Parameter *)(local_1c0 + 0x30));
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)(local_1c0 + 0x8f));
  this = std::__shared_ptr_access<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )&ioHandler_);
  jsonrpcpp::Request::to_json_abi_cxx11_((Request *)local_1c0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump((string_t *)(local_1c0 + 0x10),
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)local_1c0,-1,' ',false,strict);
  IOHandler::addMessageToSend(this,(string *)(local_1c0 + 0x10));
  std::__cxx11::string::~string((string *)(local_1c0 + 0x10));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_1c0);
  this_00 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&messageParser_);
  uVar1 = jsonrpcpp::Id::int_id((Id *)local_48);
  std::
  function<void(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)>
  ::
  function<void(&)(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&),void>
            ((function<void(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)>
              *)&local_1e0,response_workspace_workspaceFolders);
  MessageParser::register_response_callback(this_00,uVar1,&local_1e0);
  std::
  function<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_1e0);
  jsonrpcpp::Request::~Request((Request *)local_110);
  jsonrpcpp::Id::~Id((Id *)local_48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)((long)&id.string_id_.field_2 + 8));
  return;
}

Assistant:

void lsp::LanguageService::toClient_request_workspace_workspaceFolders()
{
    json paramsjson = nullptr;
    jsonrpcpp::Id id(getNextRequestID());
    jsonrpcpp::Request request(id, "workspace/workspaceFolders", paramsjson);
    ioHandler_->addMessageToSend(request.to_json().dump());
    messageParser_->register_response_callback(id.int_id(), response_workspace_workspaceFolders);
}